

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

void __thiscall ot::commissioner::coap::Coap::CancelRequests(Coap *this)

{
  bool bVar1;
  RequestHolder *pRVar2;
  element_type *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  string_view fmt;
  format_args args;
  anon_class_1_0_00000001 local_17a;
  v10 local_179;
  v10 *local_178;
  char *local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  Error local_148;
  Error local_120;
  allocator local_e1;
  undefined1 local_e0 [8];
  string uri;
  Coap *this_local;
  undefined1 local_a0 [16];
  v10 *local_90;
  char *local_88;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_80;
  v10 *local_78;
  char *pcStack_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  Coap **local_38;
  undefined1 *local_30;
  Coap **local_28;
  Coap **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  uri.field_2._8_8_ = this;
  while( true ) {
    bVar1 = RequestsCache::IsEmpty(&this->mRequestsCache);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_e0,"UNKNOWN_URI",&local_e1);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    pRVar2 = RequestsCache::Front(&this->mRequestsCache);
    this_00 = std::
              __shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)pRVar2);
    Message::GetUriPath(&local_120,this_00,(string *)local_e0);
    Error::IgnoreError(&local_120);
    Error::~Error(&local_120);
    pRVar2 = RequestsCache::Front(&this->mRequestsCache);
    CancelRequests::anon_class_1_0_00000001::operator()(&local_17a);
    local_58 = &local_178;
    local_60 = &local_179;
    bVar3 = ::fmt::v10::operator()(local_60);
    local_170 = (char *)bVar3.size_;
    local_178 = (v10 *)bVar3.data_;
    ::fmt::v10::detail::
    check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
              ();
    local_68 = &local_168;
    local_78 = local_178;
    pcStack_70 = local_170;
    local_80 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_e0;
    local_50 = &local_78;
    local_90 = local_178;
    local_88 = local_170;
    local_48 = local_90;
    pcStack_40 = local_88;
    this_local = (Coap *)::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                                   (local_80,(v10 *)this_00,local_68);
    local_30 = local_a0;
    local_38 = &this_local;
    local_18 = 0xd;
    fmt.size_ = 0xd;
    fmt.data_ = local_88;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    ::fmt::v10::vformat_abi_cxx11_(&local_168,local_90,fmt,args);
    Error::Error(&local_148,kCancelled,&local_168);
    FinalizeTransaction(this,pRVar2,(Response *)0x0,&local_148);
    Error::~Error(&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)local_e0);
  }
  return;
}

Assistant:

void Coap::CancelRequests()
{
    while (!mRequestsCache.IsEmpty())
    {
        std::string uri = "UNKNOWN_URI";
        mRequestsCache.Front().mRequest->GetUriPath(uri).IgnoreError();
        FinalizeTransaction(mRequestsCache.Front(), nullptr, ERROR_CANCELLED("request to {} was cancelled", uri));
    }
}